

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O3

void __thiscall
jessilib::impl_join::
join_mb_append<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
          (impl_join *this,string *out_string,
          basic_string_view<char8_t,_std::char_traits<char8_t>_> *in_string,
          basic_string_view<char8_t,_std::char_traits<char8_t>_> *in_args)

{
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  
  in_string_00._M_str = (char8_t *)in_args;
  in_string_00._M_len = out_string->_M_string_length;
  ustring_to_mbstring<char8_t>(&local_40,(jessilib *)(out_string->_M_dataplus)._M_p,in_string_00);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             local_40.second._M_dataplus._M_p,local_40.second._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.second._M_dataplus._M_p != &local_40.second.field_2) {
    operator_delete(local_40.second._M_dataplus._M_p,
                    local_40.second.field_2._M_allocated_capacity + 1);
  }
  join_mb_append<std::basic_string_view<char8_t,std::char_traits<char8_t>>>
            ((string *)this,in_string);
  return;
}

Assistant:

void join_mb_append(std::string& out_string, InT&& in_string, ArgsT&&... in_args) {
	// TODO: is this a valid approach? is mbstate fine it discard between appends?
	if constexpr (std::is_same_v<char32_t, InT>) {
		out_string += ustring_to_mbstring(std::u32string_view{ &in_string, 1 }).second;
	}
	else {
		out_string += ustring_to_mbstring(in_string).second;
	}

	join_mb_append(out_string, std::forward<ArgsT>(in_args)...);
}